

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Upsert * sqlite3UpsertNew(sqlite3 *db,ExprList *pTarget,Expr *pTargetWhere,ExprList *pSet,
                         Expr *pWhere,Upsert *pNext)

{
  Upsert *pUVar1;
  
  pUVar1 = (Upsert *)sqlite3DbMallocZero(db,0x58);
  if (pUVar1 == (Upsert *)0x0) {
    sqlite3ExprListDelete(db,pTarget);
    sqlite3ExprDelete(db,pTargetWhere);
    sqlite3ExprListDelete(db,pSet);
    sqlite3ExprDelete(db,pWhere);
    sqlite3UpsertDelete(db,pNext);
  }
  else {
    pUVar1->pUpsertTarget = pTarget;
    pUVar1->pUpsertTargetWhere = pTargetWhere;
    pUVar1->pUpsertSet = pSet;
    pUVar1->pUpsertWhere = pWhere;
    pUVar1->isDoUpdate = pSet != (ExprList *)0x0;
    pUVar1->pNextUpsert = pNext;
  }
  return pUVar1;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertNew(
  sqlite3 *db,           /* Determines which memory allocator to use */
  ExprList *pTarget,     /* Target argument to ON CONFLICT, or NULL */
  Expr *pTargetWhere,    /* Optional WHERE clause on the target */
  ExprList *pSet,        /* UPDATE columns, or NULL for a DO NOTHING */
  Expr *pWhere,          /* WHERE clause for the ON CONFLICT UPDATE */
  Upsert *pNext          /* Next ON CONFLICT clause in the list */
){
  Upsert *pNew;
  pNew = sqlite3DbMallocZero(db, sizeof(Upsert));
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pTarget);
    sqlite3ExprDelete(db, pTargetWhere);
    sqlite3ExprListDelete(db, pSet);
    sqlite3ExprDelete(db, pWhere);
    sqlite3UpsertDelete(db, pNext);
    return 0;
  }else{
    pNew->pUpsertTarget = pTarget;
    pNew->pUpsertTargetWhere = pTargetWhere;
    pNew->pUpsertSet = pSet;
    pNew->pUpsertWhere = pWhere;
    pNew->isDoUpdate = pSet!=0;
    pNew->pNextUpsert = pNext;
  }
  return pNew;
}